

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.cpp
# Opt level: O2

BSTR SysAllocStringLen(OLECHAR *psz,UINT len)

{
  size_t __n;
  HANDLE hHeap;
  undefined8 *puVar1;
  BSTR __dest;
  
  if (len < 0x7ffffff4) {
    hHeap = GetProcessHeap();
    puVar1 = (undefined8 *)HeapAlloc(hHeap,0,(ulong)(len * 2 + 0x19 & 0xfffffff0));
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = 0;
      __n = (ulong)len * 2;
      *(int *)((long)puVar1 + 4) = (int)__n;
      __dest = (BSTR)(puVar1 + 1);
      if (psz != (OLECHAR *)0x0) {
        memcpy(__dest,psz,__n);
      }
      __dest[len] = L'\0';
      return __dest;
    }
  }
  return (BSTR)0x0;
}

Assistant:

SysAllocStringLen(const OLECHAR *psz, UINT len)
{

    BSTR bstr;
    DWORD cbTotal = 0;

    if (FAILED(CbSysStringSize(len, FALSE, &cbTotal)))
        return NULL;

    bstr = (OLECHAR *)HeapAlloc(GetProcessHeap(), 0, cbTotal);

    if(bstr != NULL) {

#if defined(_WIN64)
        // NOTE: There are some apps which peek back 4 bytes to look at
        // the size of the BSTR. So, in case of 64-bit code,
        // we need to ensure that the BSTR length can be found by
        // looking one DWORD before the BSTR pointer.
        *(DWORD_PTR *)bstr = (DWORD_PTR) 0;
        bstr = (BSTR) ((char *) bstr + sizeof (DWORD));
#endif
        *(DWORD FAR*)bstr = (DWORD)len * sizeof(OLECHAR);

        bstr = (BSTR) ((char*) bstr + sizeof(DWORD));

        if(psz != NULL){
            memcpy(bstr, psz, len * sizeof(OLECHAR));
        }

        bstr[len] = '\0'; // always 0 terminate
    }

    return bstr;
}